

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

IndexPair __thiscall
slang::IntervalMap<int,int,0u>::
modifyRoot<slang::IntervalMapDetails::LeafNode<int,int,16u,true>,slang::IntervalMapDetails::LeafNode<int,int,16u,false>,true>
          (IntervalMap<int,int,0u> *this,LeafNode<int,_int,_16U,_true> *rootNode,uint32_t position,
          allocator_type *alloc)

{
  uint32_t uVar1;
  ulong uVar2;
  IndexPair IVar3;
  LeafNode<int,_int,_16U,_false> *pLVar4;
  undefined4 *puVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  uint32_t sizes [2];
  NodeRef nodes [2];
  uint32_t local_50 [2];
  ulong local_48 [3];
  
  IVar3 = IntervalMapDetails::distribute(2,*(uint32_t *)(this + 0xc4),0x10,local_50,position);
  local_48[0] = 0;
  local_48[1] = 0;
  iVar6 = 0;
  lVar9 = 0;
  do {
    pLVar4 = PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>
                       ((PoolAllocator<char,192ul,64ul> *)alloc);
    uVar1 = local_50[lVar9];
    if (uVar1 != 0) {
      lVar7 = 0;
      do {
        uVar8 = iVar6 + (int)lVar7;
        (pLVar4->super_NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U>).first[lVar7] =
             (rootNode->super_NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U>).first
             [uVar8];
        (pLVar4->super_NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U>).second[lVar7] =
             (rootNode->super_NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U>).second
             [uVar8];
        lVar7 = lVar7 + 1;
      } while (uVar1 != (uint32_t)lVar7);
    }
    iVar6 = iVar6 + uVar1;
    local_48[lVar9] = (ulong)pLVar4 & 0xffffffffffffffc0 | (ulong)(uVar1 - 1);
    bVar10 = lVar9 == 0;
    lVar9 = lVar9 + 1;
  } while (bVar10);
  memset(this,0,0xc0);
  lVar9 = 0;
  do {
    uVar2 = local_48[lVar9];
    puVar5 = (undefined4 *)(uVar2 & 0xffffffffffffffc0);
    iVar6 = puVar5[1];
    if (1 < (ulong)local_50[lVar9]) {
      lVar7 = 0;
      do {
        if (iVar6 <= (int)puVar5[lVar7 * 2 + 3]) {
          iVar6 = puVar5[lVar7 * 2 + 3];
        }
        lVar7 = lVar7 + 1;
      } while ((ulong)local_50[lVar9] - 1 != lVar7);
    }
    *(ulong *)(this + lVar9 * 8 + 0x60) = CONCAT44(iVar6,*puVar5);
    *(ulong *)(this + lVar9 * 8) = uVar2;
    bVar10 = lVar9 == 0;
    lVar9 = lVar9 + 1;
  } while (bVar10);
  *(undefined4 *)(this + 0xc4) = 2;
  *(int *)(this + 0xc0) = *(int *)(this + 0xc0) + 1;
  return IVar3;
}

Assistant:

IntervalMapDetails::IndexPair IntervalMap<TKey, TValue, N>::modifyRoot(TRootNode& rootNode,
                                                                       uint32_t position,
                                                                       allocator_type& alloc) {
    using namespace IntervalMapDetails;

    // Split the root branch node into two new nodes.
    constexpr uint32_t NumNodes = 2;
    uint32_t sizes[NumNodes];
    IndexPair newOffset = distribute(NumNodes, rootSize, Leaf::Capacity, sizes, position);

    // Construct new nodes.
    uint32_t pos = 0;
    NodeRef nodes[NumNodes];
    for (uint32_t i = 0; i < NumNodes; i++) {
        auto newNode = alloc.template emplace<TNewNode>();
        uint32_t size = sizes[i];

        newNode->copy(rootNode, pos, 0, size);
        nodes[i] = NodeRef(newNode, size);
        pos += size;
    }

    if (SwitchToBranch) {
        // Destroy the old root leaf and switch it to a branch node.
        rootLeaf.~RootLeaf();
        new (&rootBranch) RootBranch();
    }

    for (uint32_t i = 0; i < NumNodes; i++) {
        rootBranch.keyAt(i) = nodes[i].template get<TNewNode>().getBounds(sizes[i]);
        rootBranch.childAt(i) = nodes[i];
    }

    rootSize = NumNodes;
    height++;
    return newOffset;
}